

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzp_compress.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  undefined1 local_90 [8];
  Mzp mzp;
  string mzp_out;
  
  mzp_out.field_2._8_8_ = argv;
  if (argc < 3) {
    main_cold_1();
    iVar3 = -1;
  }
  else {
    mzp.entry_data.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    mzp.entry_data.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    mzp.entry_headers.
    super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    mzp.entry_headers.
    super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    mzp.header.magic[0] = '\0';
    mzp.header.magic[1] = '\0';
    mzp.header.magic[2] = '\0';
    mzp.header.magic[3] = '\0';
    mzp.header.magic[4] = '\0';
    mzp.header.magic[5] = '\0';
    mzp.header.archive_entry_count = 0;
    mzp.entry_headers.
    super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    uVar4 = 2;
    iVar2 = 0;
    do {
      mzp.entry_data.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&mzp_out._M_string_length;
      mzp_out._M_dataplus._M_p = (pointer)0x0;
      mzp_out._M_string_length._0_1_ = 0;
      bVar1 = mg::fs::read_file(*(char **)(mzp_out.field_2._8_8_ + uVar4 * 8),
                                (string *)
                                &mzp.entry_data.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      iVar3 = -1;
      if (bVar1) {
        fprintf(_stderr,"Adding file %s\n",*(undefined8 *)(mzp_out.field_2._8_8_ + uVar4 * 8));
        if (mzp.entry_headers.
            super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            mzp.entry_headers.
            super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::
          vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>::
          _M_realloc_insert<>((vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                               *)&mzp,(iterator)
                                      mzp.entry_headers.
                                      super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
        }
        else {
          (mzp.entry_headers.
           super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
           ._M_impl.super__Vector_impl_data._M_start)->sector_offset = 0;
          (mzp.entry_headers.
           super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
           ._M_impl.super__Vector_impl_data._M_start)->byte_offset = 0;
          (mzp.entry_headers.
           super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
           ._M_impl.super__Vector_impl_data._M_start)->size_sectors = 0;
          (mzp.entry_headers.
           super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
           ._M_impl.super__Vector_impl_data._M_start)->size_bytes = 0;
          mzp.entry_headers.
          super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
          ._M_impl.super__Vector_impl_data._M_start =
               mzp.entry_headers.
               super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
               ._M_impl.super__Vector_impl_data._M_start + 1;
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mzp.entry_headers.
                    super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &mzp.entry_data.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        iVar3 = iVar2;
      }
      if (mzp.entry_data.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&mzp_out._M_string_length)
      {
        operator_delete(mzp.entry_data.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        CONCAT71(mzp_out._M_string_length._1_7_,(undefined1)mzp_out._M_string_length
                                ) + 1);
      }
      if (!bVar1) goto LAB_00103694;
      uVar4 = uVar4 + 1;
      iVar2 = iVar3;
    } while ((uint)argc != uVar4);
    mzp.entry_data.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&mzp_out._M_string_length;
    mzp_out._M_dataplus._M_p = (pointer)0x0;
    mzp_out._M_string_length._0_1_ = 0;
    mg::data::mzp_write((Mzp *)local_90,
                        (string *)
                        &mzp.entry_data.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar1 = mg::fs::write_file(*(char **)(mzp_out.field_2._8_8_ + 8),
                               (string *)
                               &mzp.entry_data.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    iVar3 = -1;
    if (bVar1) {
      iVar3 = 0;
      fprintf(_stderr,"Wrote %ld bytes to %s\n",mzp_out._M_dataplus._M_p,
              *(undefined8 *)(mzp_out.field_2._8_8_ + 8));
    }
    if (mzp.entry_data.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&mzp_out._M_string_length) {
      operator_delete(mzp.entry_data.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      CONCAT71(mzp_out._M_string_length._1_7_,(undefined1)mzp_out._M_string_length)
                      + 1);
    }
LAB_00103694:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&mzp.entry_headers.
                  super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (mzp.header != (MzpArchiveHeader)0x0) {
      operator_delete((void *)mzp.header,
                      (long)mzp.entry_headers.
                            super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)mzp.header);
    }
  }
  return iVar3;
}

Assistant:

int main(int argc, char **argv) {
  if (argc < 3) {
    fprintf(stderr, "%s output input [input..]\n", argv[0]);
    return -1;
  }

  // Constrct new MZP
  mg::data::Mzp mzp;

  // Read each input file as a new MZP record
  for (int i = 2; i < argc; i++) {
    std::string entry_data;
    if (!mg::fs::read_file(argv[i], entry_data)) {
      return -1;
    }

    fprintf(stderr, "Adding file %s\n", argv[i]);
    mzp.entry_headers.emplace_back();
    mzp.entry_data.emplace_back(entry_data);
  }

  // Write out the archive
  std::string mzp_out;
  mg::data::mzp_write(mzp, mzp_out);
  if (!mg::fs::write_file(argv[1], mzp_out)) {
    return -1;
  }
  fprintf(stderr, "Wrote %ld bytes to %s\n", mzp_out.size(), argv[1]);

  return 0;
}